

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O0

void pzgeom::TPZArc3D::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double *pdVar1;
  _func_int **nelem;
  TPZAdmChunkVector<TPZGeoNode,_10> *this;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  TPZGeoMesh *in_RDI;
  TPZGeoElRefPattern<pzgeom::TPZArc3D> *gel;
  int j;
  TPZManVector<double,_3> cods;
  int i;
  TPZManVector<long,_3> indexes;
  REAL coords [3] [3];
  TPZGeoMesh *in_stack_fffffffffffffeb0;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffeb8;
  int64_t in_stack_fffffffffffffec8;
  TPZChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffee0;
  TPZVec<long> *in_stack_fffffffffffffee8;
  TPZGeoElRefPattern<pzgeom::TPZArc3D> *in_stack_fffffffffffffef0;
  int local_f8;
  TPZVec<double> local_e0;
  int local_a4;
  TPZVec<long> local_a0;
  double local_68 [4];
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_30;
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  TPZGeoMesh *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  memset(local_68,0,0x48);
  local_68[0] = 1.0;
  local_48 = 0x3ff0000000000000;
  local_38 = 0x3fe6a09e667f3bcd;
  local_30 = 0x3fe6a09e667f3bcd;
  pdVar1 = TPZVec<double>::operator[](local_20,0);
  *pdVar1 = 1.0;
  pdVar1 = TPZVec<double>::operator[](local_20,1);
  *pdVar1 = 1.0;
  TPZManVector<long,_3>::TPZManVector
            ((TPZManVector<long,_3> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (double *)in_stack_fffffffffffffed0);
    for (local_f8 = 0; local_f8 < 3; local_f8 = local_f8 + 1) {
      pdVar1 = TPZVec<double>::operator[](local_18,(long)local_f8);
      in_stack_fffffffffffffee8 =
           (TPZVec<long> *)(*pdVar1 + local_68[(long)local_a4 * 3 + (long)local_f8]);
      in_stack_fffffffffffffef0 =
           (TPZGeoElRefPattern<pzgeom::TPZArc3D> *)
           TPZVec<double>::operator[](&local_e0,(long)local_f8);
      *(TPZVec<long> **)
       &(in_stack_fffffffffffffef0->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl =
           in_stack_fffffffffffffee8;
    }
    in_stack_fffffffffffffee0 = TPZGeoMesh::NodeVec(local_8);
    in_stack_fffffffffffffedc =
         TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffeb8);
    nelem = (_func_int **)(long)in_stack_fffffffffffffedc;
    in_stack_fffffffffffffed0 =
         (TPZChunkVector<TPZGeoNode,_10> *)TPZVec<long>::operator[](&local_a0,(long)local_a4);
    (in_stack_fffffffffffffed0->super_TPZSavable)._vptr_TPZSavable = nelem;
    this = TPZGeoMesh::NodeVec(local_8);
    in_stack_fffffffffffffeb8 =
         (TPZAdmChunkVector<TPZGeoNode,_10> *)TPZVec<long>::operator[](&local_a0,(long)local_a4);
    in_stack_fffffffffffffeb0 =
         (TPZGeoMesh *)
         TPZChunkVector<TPZGeoNode,_10>::operator[](in_stack_fffffffffffffed0,(int64_t)nelem);
    TPZGeoNode::Initialize
              ((TPZGeoNode *)this,(TPZVec<double> *)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffeb0);
  }
  operator_new(800);
  TPZGeoElRefPattern<pzgeom::TPZArc3D>::TPZGeoElRefPattern
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
             (TPZGeoMesh *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  TPZManVector<long,_3>::~TPZManVector((TPZManVector<long,_3> *)in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void TPZArc3D::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    REAL coords[3][3] = {
        {1,0,0},
        {0,1,0},
        {M_SQRT1_2,M_SQRT1_2,0}
    };
    size[0] = 1.;
    size[1] = 1.;
    
    TPZManVector<int64_t,3> indexes(3);
    for (int i=0; i<3; i++) {
        TPZManVector<REAL,3> cods(3,0.);
        for (int j=0; j<3; j++) {
            cods[j] = lowercorner[j]+coords[i][j];
        }
        indexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[indexes[i]].Initialize(cods, gmesh);
    }
    TPZGeoElRefPattern<TPZArc3D> *gel = new TPZGeoElRefPattern<TPZArc3D>(indexes,matid,gmesh);
}